

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityIdentifier.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EntityIdentifier::Decode(EntityIdentifier *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (5 < KVar1) {
    SimulationIdentifier::Decode(&this->super_SimulationIdentifier,stream);
    KDataStream::Read<unsigned_short>
              (stream,(unsigned_short *)&(this->super_SimulationIdentifier).field_0xc);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityIdentifier::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < EntityIdentifier::ENTITY_IDENTIFER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    SimulationIdentifier::Decode( stream );
    stream >> m_ui16EntityID;
}